

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

amqp_table_entry_t * amqp_table_get_entry_by_key(amqp_table_t *table,amqp_bytes_t key)

{
  amqp_bytes_t l;
  amqp_bytes_t r;
  int iVar1;
  void *in_RSI;
  int *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (*in_RDI <= iVar2) {
      return (amqp_table_entry_t *)0x0;
    }
    r.bytes = in_RSI;
    r.len = (size_t)in_RDI;
    l.bytes._0_4_ = in_stack_ffffffffffffffd8;
    l.len = 0x1156a3;
    l.bytes._4_4_ = iVar2;
    iVar1 = amqp_bytes_equal(r,l);
    if (iVar1 != 0) break;
    iVar2 = iVar2 + 1;
  }
  return (amqp_table_entry_t *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x28);
}

Assistant:

amqp_table_entry_t *amqp_table_get_entry_by_key(const amqp_table_t *table,
                                                const amqp_bytes_t key) {
  int i;
  assert(table != NULL);
  for (i = 0; i < table->num_entries; ++i) {
    if (amqp_bytes_equal(table->entries[i].key, key)) {
      return &table->entries[i];
    }
  }
  return NULL;
}